

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O1

int luaL_fileresult(lua_State *L,int stat,char *fname)

{
  int *piVar1;
  char *s;
  int iVar2;
  
  piVar1 = __errno_location();
  if (stat == 0) {
    iVar2 = *piVar1;
    lua_pushnil(L);
    s = strerror(iVar2);
    if (fname == (char *)0x0) {
      lua_pushstring(L,s);
    }
    else {
      lua_pushfstring(L,"%s: %s",fname,s);
    }
    lua_pushinteger(L,(long)iVar2);
    iVar2 = 3;
  }
  else {
    iVar2 = 1;
    lua_pushboolean(L,1);
  }
  return iVar2;
}

Assistant:

LUALIB_API int luaL_fileresult (lua_State *L, int stat, const char *fname) {
  int en = errno;  /* calls to Lua API may change this value */
  if (stat) {
    lua_pushboolean(L, 1);
    return 1;
  }
  else {
    lua_pushnil(L);
    if (fname)
      lua_pushfstring(L, "%s: %s", fname, strerror(en));
    else
      lua_pushstring(L, strerror(en));
    lua_pushinteger(L, en);
    return 3;
  }
}